

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  uint uVar1;
  char *pcVar2;
  short *psVar3;
  undefined8 *in_RCX;
  long in_RSI;
  Mat *in_RDI;
  int n_9;
  int n_8;
  int n_7;
  int n_6;
  int o3 [4];
  int o2 [4];
  int o1 [4];
  int o0 [4];
  int d5_1 [4];
  int d4_1 [4];
  int d3_1 [4];
  int d2_1 [4];
  int d1_1 [4];
  int d0_1 [4];
  int w3_1 [6];
  int w2_1 [6];
  int w1_1 [6];
  int w0_1 [6];
  int s5 [6];
  int s4 [6];
  int s3 [6];
  int s2 [6];
  int s1 [6];
  int s0 [6];
  int *out_tile;
  int i_2;
  int *outRow3;
  int *outRow2;
  int *outRow1;
  int *outRow0;
  int j_1;
  Mat out;
  Mat out_tm;
  int p_1;
  int nRowBlocks_2;
  int nColBlocks_2;
  int h_tm_2;
  int w_tm_2;
  Mat top_blob_bordered;
  int n_5;
  int n_4;
  short *k0;
  short *r0_1;
  int q_1;
  int sum0 [36];
  int *output0_tm;
  int i_1;
  Mat kernel0_tm;
  Mat out0_tm;
  int p;
  int tiles_1;
  int nRowBlocks_1;
  int nColBlocks_1;
  int h_tm_1;
  int w_tm_1;
  Mat top_blob_tm;
  int n_3;
  int n_2;
  int n_1;
  int n;
  short t5 [6];
  short t4 [6];
  short t3 [6];
  short t2 [6];
  short t1 [6];
  short t0 [6];
  short w5 [6];
  short w4 [6];
  short w3 [6];
  short w2 [6];
  short w1 [6];
  short w0 [6];
  short d5 [6];
  short d4 [6];
  short d3 [6];
  short d2 [6];
  short d1 [6];
  short d0 [6];
  int i;
  char *r5;
  char *r4;
  char *r3;
  char *r2;
  char *r1;
  char *r0;
  int j;
  short *out_tm0;
  char *img;
  int q;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  int h_tm;
  int w_tm;
  Mat bottom_blob_tm;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Mat *m;
  Mat *in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  int _c;
  undefined8 in_stack_fffffffffffff788;
  Mat *in_stack_fffffffffffff790;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  int aiStack_818 [4];
  int aiStack_808 [4];
  int aiStack_7f8 [4];
  int aiStack_7e8 [4];
  int local_7d8 [4];
  int local_7c8 [4];
  int local_7b8 [4];
  int local_7a8 [4];
  int local_798 [4];
  int local_788 [4];
  int local_778 [8];
  int local_758 [8];
  int local_738 [8];
  int local_718 [8];
  int aiStack_6f8 [8];
  int aiStack_6d8 [8];
  int aiStack_6b8 [8];
  int aiStack_698 [8];
  int aiStack_678 [8];
  int aiStack_658 [8];
  Mat *local_638;
  int local_62c;
  int *local_628;
  int *local_620;
  int *local_618;
  int *local_610;
  int local_604;
  Mat local_600;
  Mat local_5c0;
  int local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  Mat local_568;
  Mat local_528;
  int local_4e8;
  int local_4e4;
  short *local_4e0;
  Mat local_4d8;
  short *local_498;
  int local_48c;
  int local_488 [38];
  int *local_3f0;
  int local_3e4;
  Mat local_3e0;
  Mat local_3a0;
  int local_360;
  int local_35c;
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  Mat local_348;
  Mat local_308;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  short local_2b4 [6];
  short local_2a8 [6];
  short local_29c [6];
  short local_290 [6];
  short local_284 [6];
  short local_278 [6];
  short local_26c [6];
  short local_260 [6];
  short local_254 [6];
  short local_248 [6];
  short local_23c [6];
  short local_230 [6];
  short asStack_224 [6];
  short asStack_218 [6];
  short asStack_20c [6];
  short asStack_200 [6];
  short asStack_1f4 [6];
  short asStack_1e8 [6];
  int local_1dc;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  int local_1a4;
  Mat local_1a0;
  short *local_160;
  Mat local_158;
  char *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  Mat local_f8;
  undefined1 local_a8 [112];
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  
  local_24 = in_RDI->w;
  local_28 = in_RDI->h;
  local_2c = in_RDI->c;
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  Mat::Mat((Mat *)(local_a8 + 0x30),in_RDI);
  uVar1 = local_30 + 3;
  if ((int)(local_30 + 3) < 0) {
    uVar1 = local_30 + 6;
  }
  local_30 = uVar1 & 0xfffffffc;
  uVar1 = local_34 + 3;
  if ((int)(local_34 + 3) < 0) {
    uVar1 = local_34 + 6;
  }
  local_34 = uVar1 & 0xfffffffc;
  local_24 = local_30 + 2;
  local_28 = local_34 + 2;
  local_a8._32_8_ = local_20[4];
  local_a8._0_8_ = *local_20;
  local_a8._16_8_ = local_20[2];
  local_a8._24_8_ = local_20[3];
  local_a8._8_8_ = local_20[2];
  m = (Mat *)local_a8;
  copy_make_border((Mat *)o0._0_8_,(Mat *)o1._8_8_,o1[1],o1[0],o2[3],o2[2],d5_1[0],(float)o2[1],
                   (Option *)d5_1._8_8_);
  Mat::Mat(&local_f8);
  uVar1 = local_30;
  if ((int)local_30 < 0) {
    uVar1 = local_30 + 3;
  }
  local_fc = ((int)uVar1 >> 2) * 6;
  uVar1 = local_34;
  if ((int)local_34 < 0) {
    uVar1 = local_34 + 3;
  }
  local_100 = ((int)uVar1 >> 2) * 6;
  local_104 = local_100 / 6;
  local_108 = local_fc / 6;
  local_10c = local_104 * local_108;
  Mat::create(in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
              (int)in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20),
              (size_t)in_stack_fffffffffffff778,(Allocator *)m);
  for (local_110 = 0; local_110 < local_2c; local_110 = local_110 + 1) {
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    pcVar2 = Mat::operator_cast_to_signed_char_(&local_158);
    Mat::~Mat((Mat *)0x146159);
    local_118 = pcVar2;
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    psVar3 = Mat::operator_cast_to_short_(&local_1a0);
    Mat::~Mat((Mat *)0x1461a5);
    local_160 = psVar3;
    for (local_1a4 = 0; local_1a4 < local_104; local_1a4 = local_1a4 + 1) {
      local_1b0 = local_118 + local_24 * local_1a4 * 4;
      local_1b8 = local_1b0 + local_24;
      local_1c0 = local_1b8 + local_24;
      local_1c8 = local_1c0 + local_24;
      local_1d0 = local_1c8 + local_24;
      local_1d8 = local_1c8 + local_24 + local_24;
      for (local_1dc = 0; local_1dc < local_108; local_1dc = local_1dc + 1) {
        for (local_2b8 = 0; local_2b8 < 6; local_2b8 = local_2b8 + 1) {
          asStack_1e8[local_2b8] = (short)local_1b0[local_2b8];
          asStack_1f4[local_2b8] = (short)local_1b8[local_2b8];
          asStack_200[local_2b8] = (short)local_1c0[local_2b8];
          asStack_20c[local_2b8] = (short)local_1c8[local_2b8];
          asStack_218[local_2b8] = (short)local_1d0[local_2b8];
          asStack_224[local_2b8] = (short)local_1d8[local_2b8];
        }
        for (local_2bc = 0; local_2bc < 6; local_2bc = local_2bc + 1) {
          local_230[local_2bc] =
               asStack_1e8[local_2bc] * 4 + asStack_200[local_2bc] * -5 + asStack_218[local_2bc];
          local_23c[local_2bc] =
               asStack_1f4[local_2bc] * -4 + asStack_200[local_2bc] * -4 + asStack_20c[local_2bc] +
               asStack_218[local_2bc];
          local_248[local_2bc] =
               ((asStack_1f4[local_2bc] * 4 + asStack_200[local_2bc] * -4) - asStack_20c[local_2bc])
               + asStack_218[local_2bc];
          local_254[local_2bc] =
               (asStack_1f4[local_2bc] * -2 - asStack_200[local_2bc]) + asStack_20c[local_2bc] * 2 +
               asStack_218[local_2bc];
          local_260[local_2bc] =
               (asStack_1f4[local_2bc] * 2 - asStack_200[local_2bc]) + asStack_20c[local_2bc] * -2 +
               asStack_218[local_2bc];
          local_26c[local_2bc] =
               asStack_1f4[local_2bc] * 4 + asStack_20c[local_2bc] * -5 + asStack_224[local_2bc];
        }
        local_278[0] = local_230[0];
        local_284[0] = local_230[1];
        local_290[0] = local_230[2];
        local_29c[0] = local_230[3];
        local_2a8[0] = local_230[4];
        local_2b4[0] = local_230[5];
        local_278[1] = local_23c[0];
        local_284[1] = local_23c[1];
        local_290[1] = local_23c[2];
        local_29c[1] = local_23c[3];
        local_2a8[1] = local_23c[4];
        local_2b4[1] = local_23c[5];
        local_278[2] = local_248[0];
        local_284[2] = local_248[1];
        local_290[2] = local_248[2];
        local_29c[2] = local_248[3];
        local_2a8[2] = local_248[4];
        local_2b4[2] = local_248[5];
        local_278[3] = local_254[0];
        local_284[3] = local_254[1];
        local_290[3] = local_254[2];
        local_29c[3] = local_254[3];
        local_2a8[3] = local_254[4];
        local_2b4[3] = local_254[5];
        local_278[4] = local_260[0];
        local_284[4] = local_260[1];
        local_290[4] = local_260[2];
        local_29c[4] = local_260[3];
        local_2a8[4] = local_260[4];
        local_2b4[4] = local_260[5];
        local_278[5] = local_26c[0];
        local_284[5] = local_26c[1];
        local_290[5] = local_26c[2];
        local_29c[5] = local_26c[3];
        local_2a8[5] = local_26c[4];
        local_2b4[5] = local_26c[5];
        for (local_2c0 = 0; local_2c0 < 6; local_2c0 = local_2c0 + 1) {
          asStack_1e8[local_2c0] =
               local_278[local_2c0] * 4 + local_290[local_2c0] * -5 + local_2a8[local_2c0];
          asStack_1f4[local_2c0] =
               local_284[local_2c0] * -4 + local_290[local_2c0] * -4 + local_29c[local_2c0] +
               local_2a8[local_2c0];
          asStack_200[local_2c0] =
               ((local_284[local_2c0] * 4 + local_290[local_2c0] * -4) - local_29c[local_2c0]) +
               local_2a8[local_2c0];
          asStack_20c[local_2c0] =
               (local_284[local_2c0] * -2 - local_290[local_2c0]) + local_29c[local_2c0] * 2 +
               local_2a8[local_2c0];
          asStack_218[local_2c0] =
               (local_284[local_2c0] * 2 - local_290[local_2c0]) + local_29c[local_2c0] * -2 +
               local_2a8[local_2c0];
          asStack_224[local_2c0] =
               local_284[local_2c0] * 4 + local_29c[local_2c0] * -5 + local_2b4[local_2c0];
        }
        for (local_2c4 = 0; local_2c4 < 6; local_2c4 = local_2c4 + 1) {
          local_160[local_2c4] = asStack_1e8[local_2c4];
          local_160[local_2c4 + 6] = asStack_1f4[local_2c4];
          local_160[local_2c4 + 0xc] = asStack_200[local_2c4];
          local_160[local_2c4 + 0x12] = asStack_20c[local_2c4];
          local_160[local_2c4 + 0x18] = asStack_218[local_2c4];
          local_160[local_2c4 + 0x1e] = asStack_224[local_2c4];
        }
        local_1b0 = local_1b0 + 4;
        local_1b8 = local_1b8 + 4;
        local_1c0 = local_1c0 + 4;
        local_1c8 = local_1c8 + 4;
        local_1d0 = local_1d0 + 4;
        local_1d8 = local_1d8 + 4;
        local_160 = local_160 + 0x24;
      }
    }
  }
  Mat::Mat(&local_308);
  Mat::operator=(in_stack_fffffffffffff778,m);
  Mat::~Mat((Mat *)0x146d2b);
  Mat::Mat(&local_348);
  uVar1 = local_30;
  if ((int)local_30 < 0) {
    uVar1 = local_30 + 3;
  }
  local_34c = ((int)uVar1 >> 2) * 6;
  uVar1 = local_34;
  if ((int)local_34 < 0) {
    uVar1 = local_34 + 3;
  }
  local_350 = ((int)uVar1 >> 2) * 6;
  local_354 = local_350 / 6;
  local_358 = local_34c / 6;
  local_35c = local_354 * local_358;
  Mat::create(in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
              (int)in_stack_fffffffffffff788,(int)((ulong)in_stack_fffffffffffff780 >> 0x20),
              (size_t)in_stack_fffffffffffff778,(Allocator *)m);
  for (local_360 = 0; _c = (int)((ulong)in_stack_fffffffffffff780 >> 0x20), local_360 < local_38;
      local_360 = local_360 + 1) {
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    for (local_3e4 = 0; local_3e4 < local_35c; local_3e4 = local_3e4 + 1) {
      local_3f0 = Mat::row<int>(&local_3a0,local_3e4);
      memset(local_488,0,0x90);
      for (local_48c = 0; local_48c < local_2c; local_48c = local_48c + 1) {
        Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
        psVar3 = Mat::row<short>(&local_4d8,local_3e4);
        Mat::~Mat((Mat *)0x146f2b);
        local_498 = psVar3;
        local_4e0 = Mat::row<short>(&local_3e0,local_48c);
        for (local_4e4 = 0; local_4e4 < 0x24; local_4e4 = local_4e4 + 1) {
          local_488[local_4e4] =
               (int)local_498[local_4e4] * (int)local_4e0[local_4e4] + local_488[local_4e4];
        }
      }
      for (local_4e8 = 0; local_4e8 < 0x24; local_4e8 = local_4e8 + 1) {
        local_3f0[local_4e8] = local_488[local_4e8];
      }
    }
    Mat::~Mat((Mat *)0x1470d2);
    Mat::~Mat((Mat *)0x1470df);
  }
  Mat::Mat(&local_528);
  Mat::operator=(in_stack_fffffffffffff778,m);
  Mat::~Mat((Mat *)0x14713a);
  Mat::Mat(&local_568);
  Mat::create(in_stack_fffffffffffff790,(int)((ulong)in_stack_fffffffffffff788 >> 0x20),
              (int)in_stack_fffffffffffff788,_c,(size_t)in_stack_fffffffffffff778,(Allocator *)m);
  local_56c = ((int)local_30 / 4) * 6;
  local_570 = ((int)local_34 / 4) * 6;
  local_574 = local_570 / 6;
  local_578 = local_56c / 6;
  for (local_57c = 0; local_57c < local_38; local_57c = local_57c + 1) {
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff778,(int)((ulong)m >> 0x20));
    for (local_604 = 0; local_604 < local_574; local_604 = local_604 + 1) {
      local_610 = Mat::row<int>(&local_600,local_604 << 2);
      local_618 = Mat::row<int>(&local_600,local_604 * 4 + 1);
      local_620 = Mat::row<int>(&local_600,local_604 * 4 + 2);
      local_628 = Mat::row<int>(&local_600,local_604 * 4 + 3);
      for (local_62c = 0; local_62c < local_578; local_62c = local_62c + 1) {
        in_stack_fffffffffffff778 =
             (Mat *)Mat::row<int>(&local_5c0,local_604 * local_578 + local_62c);
        local_638 = in_stack_fffffffffffff778;
        for (local_81c = 0; local_81c < 6; local_81c = local_81c + 1) {
          aiStack_658[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)local_81c * 4);
          aiStack_678[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)(local_81c + 6) * 4);
          aiStack_698[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)(local_81c + 0xc) * 4);
          aiStack_6b8[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)(local_81c + 0x12) * 4);
          aiStack_6d8[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)(local_81c + 0x18) * 4);
          aiStack_6f8[local_81c] =
               *(int *)((long)&in_stack_fffffffffffff778->data + (long)(local_81c + 0x1e) * 4);
        }
        for (local_820 = 0; local_820 < 6; local_820 = local_820 + 1) {
          local_718[local_820] =
               aiStack_658[local_820] + aiStack_678[local_820] + aiStack_698[local_820] +
               aiStack_6b8[local_820] + aiStack_6d8[local_820];
          local_738[local_820] =
               (aiStack_678[local_820] - aiStack_698[local_820]) + aiStack_6b8[local_820] * 2 +
               aiStack_6d8[local_820] * -2;
          local_758[local_820] =
               aiStack_678[local_820] + aiStack_698[local_820] + aiStack_6b8[local_820] * 4 +
               aiStack_6d8[local_820] * 4;
          local_778[local_820] =
               (aiStack_678[local_820] - aiStack_698[local_820]) + aiStack_6b8[local_820] * 8 +
               aiStack_6d8[local_820] * -8 + aiStack_6f8[local_820];
        }
        local_788[0] = local_718[0];
        local_788[1] = local_738[0];
        local_788[2] = local_758[0];
        local_788[3] = local_778[0];
        local_798[0] = local_718[1];
        local_798[1] = local_738[1];
        local_798[2] = local_758[1];
        local_798[3] = local_778[1];
        local_7a8[0] = local_718[2];
        local_7a8[1] = local_738[2];
        local_7a8[2] = local_758[2];
        local_7a8[3] = local_778[2];
        local_7b8[0] = local_718[3];
        local_7b8[1] = local_738[3];
        local_7b8[2] = local_758[3];
        local_7b8[3] = local_778[3];
        local_7c8[0] = local_718[4];
        local_7c8[1] = local_738[4];
        local_7c8[2] = local_758[4];
        local_7c8[3] = local_778[4];
        local_7d8[0] = local_718[5];
        local_7d8[1] = local_738[5];
        local_7d8[2] = local_758[5];
        local_7d8[3] = local_778[5];
        for (local_824 = 0; local_824 < 4; local_824 = local_824 + 1) {
          aiStack_7e8[local_824] =
               local_788[local_824] + local_798[local_824] + local_7a8[local_824] +
               local_7b8[local_824] + local_7c8[local_824];
          aiStack_7f8[local_824] =
               (local_798[local_824] - local_7a8[local_824]) + local_7b8[local_824] * 2 +
               local_7c8[local_824] * -2;
          aiStack_808[local_824] =
               local_798[local_824] + local_7a8[local_824] + local_7b8[local_824] * 4 +
               local_7c8[local_824] * 4;
          aiStack_818[local_824] =
               (local_798[local_824] - local_7a8[local_824]) + local_7b8[local_824] * 8 +
               local_7c8[local_824] * -8 + local_7d8[local_824];
        }
        for (local_828 = 0; local_828 < 4; local_828 = local_828 + 1) {
          local_610[local_828] = aiStack_7e8[local_828] / 0x240;
          local_618[local_828] = aiStack_7f8[local_828] / 0x240;
          local_620[local_828] = aiStack_808[local_828] / 0x240;
          local_628[local_828] = aiStack_818[local_828] / 0x240;
        }
        local_610 = local_610 + 4;
        local_618 = local_618 + 4;
        local_620 = local_620 + 4;
        local_628 = local_628 + 4;
      }
    }
    Mat::~Mat((Mat *)0x1479f5);
    Mat::~Mat((Mat *)0x147a02);
  }
  copy_cut_border((Mat *)CONCAT44(o1[1],o1[0]),(Mat *)CONCAT44(o2[3],o2[2]),o2[1],o2[0],o3[3],o3[2],
                  (Option *)o0._0_8_);
  Mat::~Mat((Mat *)0x147a7c);
  Mat::~Mat((Mat *)0x147a89);
  Mat::~Mat((Mat *)0x147a96);
  Mat::~Mat((Mat *)0x147aa3);
  return;
}

Assistant:

static void conv3x3s1_winograd43_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(6*6, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {4.0f, 0.0f, -5.0f, 0.0f, 1.0f, 0.0f},
        //     {0.0f,-4.0f, -4.0f, 1.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f, -4.0f,-1.0f, 1.0f, 0.0f},
        //     {0.0f,-2.0f, -1.0f, 2.0f, 1.0f, 0.0f},
        //     {0.0f, 2.0f, -1.0f,-2.0f, 1.0f, 0.0f},
        //     {0.0f, 4.0f,  0.0f,-5.0f, 0.0f, 1.0f}
        // };

		// 0 =	4 * r00  - 5 * r02	+ r04
        // 1 = -4 * (r01 + r02)  + r03 + r04
        // 2 =	4 * (r01 - r02)  - r03 + r04
        // 3 = -2 * r01 - r02 + 2 * r03 + r04
        // 4 =	2 * r01 - r02 - 2 * r03 + r04
		// 5 =	4 * r01 - 5 * r03 + r05

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 4;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;
                const signed char* r4 = r3 + w;
                const signed char* r5 = r4 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[6],d1[6],d2[6],d3[6],d4[6],d5[6];
                    short w0[6],w1[6],w2[6],w3[6],w4[6],w5[6];
                    short t0[6],t1[6],t2[6],t3[6],t4[6],t5[6];

                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                        d4[n] = r4[n];
                        d5[n] = r5[n];
                    }
                    // w = B_t * d
                    for (int n = 0; n < 6; n++)
                    {   
                        w0[n] =  4*d0[n]          - 5*d2[n]           + d4[n];
                        w1[n] =          -4*d1[n] - 4*d2[n] +   d3[n] + d4[n];
                        w2[n] =           4*d1[n] - 4*d2[n] -   d3[n] + d4[n];
                        w3[n] =          -2*d1[n] -   d2[n] + 2*d3[n] + d4[n];
                        w4[n] =           2*d1[n] -   d2[n] - 2*d3[n] + d4[n];
                        w5[n] =           4*d1[n]           - 5*d3[n]          + d5[n];
                    }
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3]; t4[0]=w0[4]; t5[0]=w0[5];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3]; t4[1]=w1[4]; t5[1]=w1[5];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3]; t4[2]=w2[4]; t5[2]=w2[5];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3]; t4[3]=w3[4]; t5[3]=w3[5];
                        t0[4]=w4[0]; t1[4]=w4[1]; t2[4]=w4[2]; t3[4]=w4[3]; t4[4]=w4[4]; t5[4]=w4[5];
                        t0[5]=w5[0]; t1[5]=w5[1]; t2[5]=w5[2]; t3[5]=w5[3]; t4[5]=w5[4]; t5[5]=w5[5];
                    }                   
                    // d = B_t * d_t
                    for (int n = 0; n < 6; n++)
                    {   
                        d0[n] =  4*t0[n]           - 5*t2[n]           + t4[n];
                        d1[n] =          - 4*t1[n] - 4*t2[n] +   t3[n] + t4[n];
                        d2[n] =            4*t1[n] - 4*t2[n] -   t3[n] + t4[n];
                        d3[n] =          - 2*t1[n] -   t2[n] + 2*t3[n] + t4[n];
                        d4[n] =            2*t1[n] -   t2[n] - 2*t3[n] + t4[n];
                        d5[n] =            4*t1[n]           - 5*t3[n]          + t5[n];
                    }                   
                    // save to out_tm
                    for (int n = 0; n < 6; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 6] = d1[n];
                        out_tm0[n+12] = d2[n];
                        out_tm0[n+18] = d3[n];
                        out_tm0[n+24] = d4[n];
                        out_tm0[n+30] = d5[n];
                    }

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    r3 += 4;
                    r4 += 4;
                    r5 += 4;

                    out_tm0 += 36;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(36, tiles, outch, 4u, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[36] = {0};

                for (int q=0; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<36; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }
                }

                for (int n=0; n<36; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[4][6] = {
        //     {1.0f, 1.0f,  1.0f, 1.0f,  1.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 2.0f, -2.0f, 0.0f},
        //     {0.0f, 1.0f,  1.0f, 4.0f,  4.0f, 0.0f},
        //     {0.0f, 1.0f, -1.0f, 8.0f, -8.0f, 1.0f}
        // };

        // 0 =	r00 + r01 + r02 + r03 +	r04
        // 1 =		  r01 - r02 + 2 * (r03 - r04)
        // 2 =		  r01 + r02 + 4 * (r03 + r04)
        // 3 =		  r01 - r02 + 8 * (r03 - r04)  + r05
        

        int w_tm = outw / 4 * 6;
        int h_tm = outh / 4 * 6;

        int nColBlocks = h_tm/6; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/6;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*4);
                int* outRow1 = out.row<int>(j*4+1);
                int* outRow2 = out.row<int>(j*4+2);
                int* outRow3 = out.row<int>(j*4+3);                

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[6],s1[6],s2[6],s3[6],s4[6],s5[6];
                    int w0[6],w1[6],w2[6],w3[6];
                    int d0[4],d1[4],d2[4],d3[4],d4[4],d5[4];
                    int o0[4],o1[4],o2[4],o3[4];
                    // load
                    for (int n = 0; n < 6; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 6];
                        s2[n] = out_tile[n+12];
                        s3[n] = out_tile[n+18];
                        s4[n] = out_tile[n+24];
                        s5[n] = out_tile[n+30];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 6; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n] +   s3[n] +   s4[n];
                        w1[n] =         s1[n] - s2[n] + 2*s3[n] - 2*s4[n];
                        w2[n] =         s1[n] + s2[n] + 4*s3[n] + 4*s4[n];
                        w3[n] =         s1[n] - s2[n] + 8*s3[n] - 8*s4[n] + s5[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0]; d0[2] = w2[0]; d0[3] = w3[0];
                        d1[0] = w0[1]; d1[1] = w1[1]; d1[2] = w2[1]; d1[3] = w3[1];
                        d2[0] = w0[2]; d2[1] = w1[2]; d2[2] = w2[2]; d2[3] = w3[2];
                        d3[0] = w0[3]; d3[1] = w1[3]; d3[2] = w2[3]; d3[3] = w3[3];
                        d4[0] = w0[4]; d4[1] = w1[4]; d4[2] = w2[4]; d4[3] = w3[4];
                        d5[0] = w0[5]; d5[1] = w1[5]; d5[2] = w2[5]; d5[3] = w3[5];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 4; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n] +   d3[n] +   d4[n];
                        o1[n] =         d1[n] - d2[n] + 2*d3[n] - 2*d4[n];
                        o2[n] =         d1[n] + d2[n] + 4*d3[n] + 4*d4[n];
                        o3[n] =         d1[n] - d2[n] + 8*d3[n] - 8*d4[n] + d5[n];
                    }
                    // save to top blob tm
                    for (int n = 0; n < 4; n++)
                    {
                        outRow0[n] = o0[n] / 576;
                        outRow1[n] = o1[n] / 576;
                        outRow2[n] = o2[n] / 576;
                        outRow3[n] = o3[n] / 576;
                    }

                    outRow0 += 4;
                    outRow1 += 4;
                    outRow2 += 4;
                    outRow3 += 4;
                }
            }
        }
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}